

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOneofClear
          (MessageGenerator *this,Printer *printer)

{
  long lVar1;
  bool bVar2;
  FieldGenerator *pFVar3;
  long lVar4;
  OneofDescriptor *pOVar5;
  FieldDescriptor *field;
  int i;
  Printer *local_e0;
  Iterator __begin4;
  Iterator __begin3;
  Formatter format;
  Iterator __end4;
  string local_60;
  Iterator __end3;
  
  i = 0;
  __begin3.descriptor = this->descriptor_;
  __begin3.idx = 0;
  __end3.idx = *(int *)(__begin3.descriptor + 0x6c);
  local_e0 = printer;
  __end3.descriptor = __begin3.descriptor;
  while( true ) {
    bVar2 = operator!=(&__begin3,&__end3);
    if (!bVar2) break;
    pOVar5 = (OneofDescriptor *)((long)__begin3.idx * 0x28 + *(long *)(__begin3.descriptor + 0x30));
    format.printer_ = local_e0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
    std::__cxx11::string::string((string *)&local_60,"oneofname",(allocator *)&__begin4);
    Formatter::Set<std::__cxx11::string>
              (&format,&local_60,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pOVar5 + 8));
    std::__cxx11::string::~string((string *)&local_60);
    Formatter::operator()<>
              (&format,
               "void $classname$::clear_$oneofname$() {\n// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n"
              );
    io::Printer::Indent(format.printer_);
    Formatter::operator()<>(&format,"switch ($oneofname$_case()) {\n");
    io::Printer::Indent(format.printer_);
    __begin4.idx = 0;
    __end4.idx = *(int *)(pOVar5 + 4);
    __begin4.descriptor = pOVar5;
    __end4.descriptor = pOVar5;
    while( true ) {
      bVar2 = operator!=(&__begin4,&__end4);
      if (!bVar2) break;
      lVar4 = (long)__begin4.idx;
      lVar1 = *(long *)(__begin4.descriptor + 0x20);
      UnderscoresToCamelCase(&local_60,*(string **)(lVar1 + 8 + lVar4 * 0x48),true);
      Formatter::operator()(&format,"case k$1$: {\n",&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      io::Printer::Indent(format.printer_);
      field = (FieldDescriptor *)(lVar1 + lVar4 * 0x48);
      bVar2 = IsStringOrMessage(field);
      if (bVar2) {
        pFVar3 = FieldGeneratorMap::get(&this->field_generators_,field);
        (*pFVar3->_vptr_FieldGenerator[10])(pFVar3,local_e0);
      }
      else {
        Formatter::operator()<>(&format,"// No need to clear\n");
      }
      Formatter::operator()<>(&format,"break;\n");
      io::Printer::Outdent(format.printer_);
      Formatter::operator()<>(&format,"}\n");
      __begin4.idx = __begin4.idx + 1;
    }
    ToUpper(&local_60,*(string **)(pOVar5 + 8));
    Formatter::operator()(&format,"case $1$_NOT_SET: {\n  break;\n}\n",&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    io::Printer::Outdent(format.printer_);
    ToUpper(&local_60,*(string **)(pOVar5 + 8));
    Formatter::operator()(&format,"}\n_oneof_case_[$1$] = $2$_NOT_SET;\n",&i,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>(&format,"}\n\n");
    i = i + 1;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&format.vars_._M_t);
    __begin3.idx = __begin3.idx + 1;
  }
  return;
}

Assistant:

void MessageGenerator::GenerateOneofClear(io::Printer* printer) {
  // Generated function clears the active field and union case (e.g. foo_case_).
  int i = 0;
  for (auto oneof : OneOfRange(descriptor_)) {
    Formatter format(printer, variables_);
    format.Set("oneofname", oneof->name());

    format(
        "void $classname$::clear_$oneofname$() {\n"
        "// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n");
    format.Indent();
    format("switch ($oneofname$_case()) {\n");
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      // We clear only allocated objects in oneofs
      if (!IsStringOrMessage(field) || IsFieldStripped(field, options_)) {
        format("// No need to clear\n");
      } else {
        field_generators_.get(field).GenerateClearingCode(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format(
        "}\n"
        "_oneof_case_[$1$] = $2$_NOT_SET;\n",
        i, ToUpper(oneof->name()));
    format.Outdent();
    format(
        "}\n"
        "\n");
    i++;
  }
}